

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLABecLaplacian::prepareForSolve(MLABecLaplacian *this)

{
  long in_RDI;
  MLABecLaplacian *in_stack_00000050;
  MLABecLaplacian *in_stack_00000470;
  
  MLCellABecLap::prepareForSolve((MLCellABecLap *)0x1555348);
  applyRobinBCTermsCoeffs(in_stack_00000470);
  averageDownCoeffs(this);
  update_singular_flags(in_stack_00000050);
  *(undefined1 *)(in_RDI + 800) = 0;
  return;
}

Assistant:

void
MLABecLaplacian::prepareForSolve ()
{
    BL_PROFILE("MLABecLaplacian::prepareForSolve()");

    MLCellABecLap::prepareForSolve();

#if (AMREX_SPACEDIM != 3)
    applyMetricTermsCoeffs();
#endif

    applyRobinBCTermsCoeffs();

    averageDownCoeffs();

    update_singular_flags();

    m_needs_update = false;
}